

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::RepeatedMessageFieldGenerator::GeneratePrivateMembers
          (RepeatedMessageFieldGenerator *this,Printer *printer)

{
  undefined1 local_50 [8];
  Formatter format;
  Printer *printer_local;
  RepeatedMessageFieldGenerator *this_local;
  
  format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)printer;
  Formatter::Formatter((Formatter *)local_50,printer,&(this->super_FieldGenerator).variables_);
  if ((this->implicit_weak_field_ & 1U) == 0) {
    Formatter::operator()<>
              ((Formatter *)local_50,"::$proto_ns$::RepeatedPtrField< $type$ > $name$_;\n");
  }
  else {
    Formatter::operator()<>
              ((Formatter *)local_50,"::$proto_ns$::WeakRepeatedPtrField< $type$ > $name$_;\n");
  }
  Formatter::~Formatter((Formatter *)local_50);
  return;
}

Assistant:

void RepeatedMessageFieldGenerator::GeneratePrivateMembers(
    io::Printer* printer) const {
  Formatter format(printer, variables_);
  if (implicit_weak_field_) {
    format("::$proto_ns$::WeakRepeatedPtrField< $type$ > $name$_;\n");
  } else {
    format("::$proto_ns$::RepeatedPtrField< $type$ > $name$_;\n");
  }
}